

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void train(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *args)

{
  byte bVar1;
  ofstream ofs;
  string outputFileName;
  FastText fasttext;
  Args a;
  Args *in_stack_fffffffffffffbe0;
  invalid_argument *this;
  char *in_stack_fffffffffffffc00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc08;
  Args *in_stack_fffffffffffffc10;
  string local_3e0 [39];
  undefined1 local_3b9;
  string local_3b8 [32];
  undefined1 local_398 [448];
  string *in_stack_fffffffffffffe28;
  FastText *in_stack_fffffffffffffe30;
  string local_198 [64];
  string *in_stack_fffffffffffffea8;
  FastText *in_stack_fffffffffffffeb0;
  string *in_stack_fffffffffffffeb8;
  Args *in_stack_fffffffffffffec0;
  Args *in_stack_fffffffffffffec8;
  FastText *in_stack_fffffffffffffed0;
  byte local_20;
  
  ::fasttext::Args::Args(in_stack_fffffffffffffc10);
  ::fasttext::Args::parseArgs
            (in_stack_fffffffffffffec0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffeb8);
  ::fasttext::FastText::FastText((FastText *)in_stack_fffffffffffffc10);
  std::operator+(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
  std::ofstream::ofstream(local_398,local_198,_S_out);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    local_3b9 = 1;
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
    std::invalid_argument::invalid_argument(this,local_3b8);
    local_3b9 = 0;
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::ofstream::close();
  ::fasttext::FastText::train(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  ::fasttext::FastText::saveModel(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  std::operator+(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
  ::fasttext::FastText::saveVectors(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  std::__cxx11::string::~string(local_3e0);
  if ((local_20 & 1) != 0) {
    std::operator+(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
    ::fasttext::FastText::saveOutput
              ((FastText *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffc00);
  }
  std::ofstream::~ofstream(local_398);
  std::__cxx11::string::~string(local_198);
  ::fasttext::FastText::~FastText((FastText *)in_stack_fffffffffffffbe0);
  ::fasttext::Args::~Args(in_stack_fffffffffffffbe0);
  return;
}

Assistant:

void train(const std::vector<std::string> args) {
  Args a = Args();
  a.parseArgs(args);
  FastText fasttext;
  std::string outputFileName(a.output + ".bin");
  std::ofstream ofs(outputFileName);
  if (!ofs.is_open()) {
    throw std::invalid_argument(
        outputFileName + " cannot be opened for saving.");
  }
  ofs.close();
  fasttext.train(a);
  fasttext.saveModel(outputFileName);
  fasttext.saveVectors(a.output + ".vec");
  if (a.saveOutput) {
    fasttext.saveOutput(a.output + ".output");
  }
}